

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void __thiscall Assimp::FBX::MeshGeometry::~MeshGeometry(MeshGeometry *this)

{
  pointer puVar1;
  void *pvVar2;
  pointer paVar3;
  pointer piVar4;
  long lVar5;
  
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__MeshGeometry_0025cbd8;
  puVar1 = (this->m_mappings).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->m_mapping_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->m_mapping_counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  lVar5 = 0x368;
  do {
    pvVar2 = *(void **)((long)&(this->super_Geometry).super_Object._vptr_Object + lVar5);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0x2a8);
  lVar5 = 0x2a8;
  do {
    pvVar2 = *(void **)((long)&(this->super_Geometry).super_Object._vptr_Object + lVar5);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0x1e8);
  lVar5 = 0;
  do {
    pvVar2 = *(void **)((long)this->m_uvs + lVar5 + -0x20);
    if ((void *)((long)this->m_uvs + lVar5 + -0x10) != pvVar2) {
      operator_delete(pvVar2);
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x100);
  paVar3 = (this->m_normals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3);
  }
  paVar3 = (this->m_binormals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3);
  }
  paVar3 = (this->m_tangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3);
  }
  puVar1 = (this->m_facesVertexStartIndices).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  paVar3 = (this->m_vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3);
  }
  piVar4 = (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4);
  }
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

MeshGeometry::~MeshGeometry() {
    // empty
}